

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

Interval *
tcu::anon_unknown_4::chooseInterval
          (Interval *__return_storage_ptr__,YesNoMaybe choice,Interval *no,Interval *yes)

{
  undefined7 uVar1;
  Interval *yes_local;
  Interval *no_local;
  YesNoMaybe choice_local;
  
  if (choice == NO) {
    uVar1 = *(undefined7 *)&no->field_0x1;
    __return_storage_ptr__->m_hasNaN = no->m_hasNaN;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = uVar1;
    __return_storage_ptr__->m_lo = no->m_lo;
    __return_storage_ptr__->m_hi = no->m_hi;
  }
  else if (choice == MAYBE) {
    Interval::operator|(__return_storage_ptr__,no,yes);
  }
  else if (choice == YES) {
    uVar1 = *(undefined7 *)&yes->field_0x1;
    __return_storage_ptr__->m_hasNaN = yes->m_hasNaN;
    *(undefined7 *)&__return_storage_ptr__->field_0x1 = uVar1;
    __return_storage_ptr__->m_lo = yes->m_lo;
    __return_storage_ptr__->m_hi = yes->m_hi;
  }
  else {
    Interval::Interval(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval chooseInterval(YesNoMaybe choice, const Interval& no, const Interval& yes)
{
	switch (choice)
	{
		case NO:	return no;
		case YES:	return yes;
		case MAYBE:	return no | yes;
		default:	DE_FATAL("Impossible case");
	}

	return Interval();
}